

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O0

void __thiscall
TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test::
~TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test
          (TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test *this)

{
  TEST_GROUP_CppUTestGroupNamerTestGroup::~TEST_GROUP_CppUTestGroupNamerTestGroup
            ((TEST_GROUP_CppUTestGroupNamerTestGroup *)0x118f0e);
  return;
}

Assistant:

TEST(NamerTestGroup, TestProperNameCaseOnWindows)
{
    if (SystemUtils::isWindowsOs())
    {
        ApprovalTestNamer namer;
        auto test = ApprovalTestNamer::currentTest();
        test.setFileName(StringUtils::toLower(test.getFileName()));
        ApprovalTestNamer::currentTest(&test);
        STRCMP_EQUAL(namer.getFileName().c_str(), "CppUTestNamerTests");
    }
}